

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          *expression,allocator_type *allocator)

{
  float *pfVar1;
  size_t sVar2;
  size_t *begin;
  size_t *end;
  CoordinateOrder *pCVar3;
  CoordinateOrder *internalCoordinateOrder;
  value_type vVar4;
  allocator_type local_61;
  Geometry<std::allocator<unsigned_long>_> local_60;
  
  View<float,_false,_std::allocator<unsigned_long>_>::View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this,(allocator_type *)&local_60)
  ;
  pfVar1 = __gnu_cxx::new_allocator<float>::allocate
                     ((new_allocator<float> *)(this + 0x40),
                      *(size_type *)(*(long *)expression + 0x30),(void *)0x0);
  *(float **)this = pfVar1;
  sVar2 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  if (sVar2 == 0) {
    pCVar3 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_60,0,pCVar3,1,true,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  else {
    begin = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
            ::shapeBegin((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                          *)expression);
    end = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::shapeEnd((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                      *)expression);
    pCVar3 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)expression);
    internalCoordinateOrder =
         BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
         ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                            *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_60,begin,end,pCVar3,
               internalCoordinateOrder,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_60);
  sVar2 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  if (sVar2 == 0) {
    marray_detail::Assert<bool>(*(ulong *)(*(long *)expression + 0x30) < 2);
    vVar4 = BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
            ::operator()((BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
                          *)expression,0);
    **(value_type **)this = vVar4;
  }
  else {
    marray_detail::Assert<bool>(*(ulong *)(*(long *)expression + 0x30) != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
              (this,expression);
  }
  Marray<float,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<float,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}